

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::TileIndependenceLSTestLarge_MD5Match_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::TileIndependenceLSTestLarge_MD5Match_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,int,int,int>>::parameter_ =
       &this->parameter_;
  this_00 = (Test *)operator_new(0x510);
  anon_unknown.dwarf_964a1d::TileIndependenceTestLarge::TileIndependenceTestLarge
            ((TileIndependenceTestLarge *)this_00);
  (((TileIndependenceTest *)&this_00->_vptr_Test)->super_CodecTestWith3Params<int,_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_int,_int,_int>_>.super_Test.
  _vptr_Test = (_func_int **)&PTR__TileIndependenceTest_00f05fd8;
  this_00[1]._vptr_Test = (_func_int **)&PTR__TileIndependenceLSTestLarge_MD5Match_Test_00f06030;
  this_00[1].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)&PTR__TileIndependenceLSTestLarge_MD5Match_Test_00f06050;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }